

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

void secp256k1_context_destroy(secp256k1_context *ctx)

{
  if (ctx == (secp256k1_context *)0x0) {
    return;
  }
  if ((ctx->ecmult_gen_ctx).built != 0) {
    secp256k1_context_preallocated_destroy(ctx);
    free(ctx);
    return;
  }
  (*(ctx->illegal_callback).fn)
            ("ctx == NULL || secp256k1_context_is_proper(ctx)",(ctx->illegal_callback).data);
  return;
}

Assistant:

void secp256k1_context_destroy(secp256k1_context* ctx) {
    ARG_CHECK_VOID(ctx == NULL || secp256k1_context_is_proper(ctx));

    /* Defined as noop */
    if (ctx == NULL) {
        return;
    }

    secp256k1_context_preallocated_destroy(ctx);
    free(ctx);
}